

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.hpp
# Opt level: O0

int __thiscall soplex::SPxSteepPR<double>::selectLeave(SPxSteepPR<double> *this)

{
  long *plVar1;
  int iVar2;
  Verbosity VVar3;
  SPxBasisBase<double> *pSVar4;
  UpdateVector<double> *pUVar5;
  SPxSolverBase<double> *this_00;
  SPxBasisBase<double> *in_RDI;
  SPxSteepPR<double> *unaff_retaddr;
  double in_stack_00000008;
  SPxSteepPR<double> *in_stack_00000010;
  Verbosity old_verbosity;
  int retid;
  SPxSteepPR<double> *in_stack_00000038;
  char *in_stack_ffffffffffffffc8;
  SPxOut *in_stack_ffffffffffffffd0;
  SSVectorBase<double> *in_stack_ffffffffffffffd8;
  undefined4 local_14;
  Verbosity local_10;
  int local_c;
  SPxBasisBase<double> *pSVar6;
  
  pSVar6 = in_RDI;
  if (((*(byte *)(*(long *)&in_RDI->theBaseId + 0x89b) & 1) == 0) ||
     ((*(byte *)(*(long *)&in_RDI->theBaseId + 0x898) & 1) == 0)) {
    if ((*(byte *)(*(long *)&in_RDI->theBaseId + 0x898) & 1) == 0) {
      local_c = selectLeaveX(unaff_retaddr,(double)in_RDI);
    }
    else {
      local_c = selectLeaveSparse(unaff_retaddr,(double)in_RDI);
    }
  }
  else {
    iVar2 = IdxSet::size((IdxSet *)&(in_RDI->thedesc).costat);
    if (1 < iVar2) {
      pSVar4 = SPxSolverBase<double>::basis(*(SPxSolverBase<double> **)&in_RDI->theBaseId);
      iVar2 = SPxBasisBase<double>::lastUpdate(pSVar4);
      if (iVar2 != 0) {
        local_c = selectLeaveHyper(in_stack_00000010,in_stack_00000008);
        goto LAB_002ac309;
      }
    }
    local_c = buildBestPriceVectorLeave(in_stack_00000038,(double)this);
  }
LAB_002ac309:
  if ((local_c < 0) && (((ulong)in_RDI[1].matrix.data & 0x100000000) == 0)) {
    *(undefined1 *)((long)&in_RDI[1].matrix.data + 4) = 1;
    if ((*(long *)(*(long *)&in_RDI->theBaseId + 0x918) != 0) &&
       (VVar3 = SPxOut::getVerbosity(*(SPxOut **)(*(long *)&in_RDI->theBaseId + 0x918)),
       4 < (int)VVar3)) {
      local_10 = SPxOut::getVerbosity(*(SPxOut **)(*(long *)&in_RDI->theBaseId + 0x918));
      plVar1 = *(long **)(*(long *)&in_RDI->theBaseId + 0x918);
      local_14 = 5;
      (**(code **)(*plVar1 + 0x10))(plVar1,&local_14);
      soplex::operator<<(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
      plVar1 = *(long **)(*(long *)&in_RDI->theBaseId + 0x918);
      (**(code **)(*plVar1 + 0x10))(plVar1,&local_10);
    }
    local_c = selectLeaveX(unaff_retaddr,(double)pSVar6);
  }
  if (-1 < local_c) {
    pSVar4 = SPxSolverBase<double>::basis(*(SPxSolverBase<double> **)&in_RDI->theBaseId);
    iVar2 = (int)((ulong)pSVar4 >> 0x20);
    pUVar5 = SPxSolverBase<double>::coPvec(*(SPxSolverBase<double> **)&in_RDI->theBaseId);
    this_00 = (SPxSolverBase<double> *)UpdateVector<double>::delta(pUVar5);
    SPxSolverBase<double>::unitVector(this_00,iVar2);
    SPxBasisBase<double>::coSolve(in_RDI,in_stack_ffffffffffffffd8,(SVectorBase<double> *)this_00);
    pUVar5 = SPxSolverBase<double>::coPvec(*(SPxSolverBase<double> **)&in_RDI->theBaseId);
    UpdateVector<double>::delta(pUVar5);
    SSVectorBase<double>::setup_and_assign<double>
              ((SSVectorBase<double> *)unaff_retaddr,(SSVectorBase<double> *)pSVar6);
    SPxSolverBase<double>::setup4solve
              (*(SPxSolverBase<double> **)&in_RDI->theBaseId,
               (SSVectorBase<double> *)&(in_RDI->matrix).memFactor,
               (SSVectorBase<double> *)&in_RDI->lastMem);
  }
  return local_c;
}

Assistant:

int SPxSteepPR<R>::selectLeave()
{
   assert(isConsistent());

   int retid;

   if(this->thesolver->hyperPricingLeave && this->thesolver->sparsePricingLeave)
   {
      if(bestPrices.size() < 2 || this->thesolver->basis().lastUpdate() == 0)
      {
         // call init method to build up price-vector and return index of largest price
         retid = buildBestPriceVectorLeave(this->thetolerance);
      }
      else
         retid = selectLeaveHyper(this->thetolerance);
   }
   else if(this->thesolver->sparsePricingLeave)
      retid = selectLeaveSparse(this->thetolerance);
   else
      retid = selectLeaveX(this->thetolerance);

   if(retid < 0 && !refined)
   {
      refined = true;
      SPX_MSG_INFO3((*this->thesolver->spxout),
                    (*this->thesolver->spxout) << "WSTEEP03 trying refinement step..\n";)
      retid = selectLeaveX(this->thetolerance / SOPLEX_STEEP_REFINETOL);
   }

   if(retid >= 0)
   {
      assert(this->thesolver->coPvec().delta().isConsistent());
      // coPvec().delta() might be not setup after the solve when it contains too many nonzeros.
      // This is intended and forcing to keep the sparsity information leads to a slowdown
      // TODO implement a dedicated solve method for unitvectors
      this->thesolver->basis().coSolve(this->thesolver->coPvec().delta(),
                                       this->thesolver->unitVector(retid));
      assert(this->thesolver->coPvec().delta().isConsistent());
      workRhs.setup_and_assign(this->thesolver->coPvec().delta());
      this->thesolver->setup4solve(&workVec, &workRhs);
   }

   return retid;
}